

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O2

Am_Constraint * __thiscall
Animation_Constraint::Constraint_Added(Animation_Constraint *this,Am_Slot *adding_slot)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  Am_Value *pAVar3;
  Am_Value_List *list;
  Am_Wrapper *pAVar4;
  uint value;
  Am_Value_List slots;
  Am_Demon_Queue queue;
  Am_Slot local_30;
  
  AVar2 = Am_Slot::Get_Key(adding_slot);
  value = (uint)AVar2;
  if ((this->primary_slot).data == (Am_Slot_Data *)0x0) {
    (this->primary_slot).data = adding_slot->data;
    Am_Slot::Get_Owner((Am_Slot *)&slots);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&slots);
    Am_Object::Set(&(this->interpolator).super_Am_Object,0x193,pAVar4,0);
    Am_Object::~Am_Object((Am_Object *)&slots);
    if (this->multi_slot == true) {
      Am_Slot::Get_Owner((Am_Slot *)&slots);
      Am_Object_Advanced::Get_Queue((Am_Object_Advanced *)&queue);
      Am_Demon_Queue::Enqueue(&queue,animator_initialize_demon,0,&this->primary_slot);
      this->must_initialize_instance = true;
      Am_Demon_Queue::~Am_Demon_Queue(&queue);
      Am_Object::~Am_Object((Am_Object *)&slots);
    }
    else {
      Am_Object::Set(&(this->interpolator).super_Am_Object,0xeb,value,0);
    }
  }
  else {
    Am_Value_List::Am_Value_List(&slots);
    if (this->must_initialize_instance == true) {
      Initialize(this);
    }
    if (this->multi_slot == true) {
      queue.data = (Am_Demon_Queue_Data *)Am_Object_Advanced::Get_Slot(&this->interpolator,0xeb);
      pAVar3 = Am_Slot::Get((Am_Slot *)&queue);
      Am_Value_List::operator=(&slots,pAVar3);
    }
    else {
      Am_Value_List::Am_Value_List((Am_Value_List *)&queue);
      local_30 = Am_Object_Advanced::Get_Slot(&this->interpolator,0xeb);
      pAVar3 = Am_Slot::Get(&local_30);
      list = Am_Value_List::Add((Am_Value_List *)&queue,pAVar3,Am_TAIL,true);
      Am_Value_List::operator=(&slots,list);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&queue);
      this->multi_slot = true;
    }
    Am_Value_List::Start(&slots);
    bVar1 = Am_Value_List::Member(&slots,value);
    if (!bVar1) {
      Am_Value_List::Add(&slots,value,Am_TAIL,true);
    }
    pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&slots);
    Am_Object::Set(&(this->interpolator).super_Am_Object,0xeb,pAVar4,0);
    Am_Value_List::~Am_Value_List(&slots);
  }
  Init_Target_Value(this,adding_slot);
  Am_Value::operator=(&this->start,&this->target);
  Am_Slot::Add_Dependency(adding_slot,&this->super_Am_Constraint);
  Am_Slot::Invalidate(adding_slot,&this->super_Am_Constraint);
  return &this->super_Am_Constraint;
}

Assistant:

Am_Constraint *
Animation_Constraint::Constraint_Added(const Am_Slot &adding_slot)
{
  Am_Slot_Key key = (int)adding_slot.Get_Key();

  if (!(Am_Slot_Data *)primary_slot) {
    primary_slot = adding_slot;

    // Make sure interpolator has a handle to the object it's animating.
    interpolator.Set(Am_OPERATES_ON, primary_slot.Get_Owner());

    if (multi_slot) {
      // queue up a demon to connect this new instance to the other
      // slots it should animate
      Am_Object_Advanced object = primary_slot.Get_Owner();
      Am_Demon_Queue queue = object.Get_Queue();
      queue.Enqueue(animator_initialize_demon, 0, primary_slot);
      // The which_bit parameter for Enqueue is zero so that when the demon is
      // called it won't affect the demon_bits in the slot.

      must_initialize_instance = true;
    } else
      interpolator.Set(Am_SLOT_TO_ANIMATE, key);
  } else {
    Am_Value_List slots;

    if (must_initialize_instance)
      Initialize();

    if (multi_slot) {
      // already a multi-slot constraint
      slots = interpolator.Get_Slot(Am_SLOT_TO_ANIMATE).Get();
    } else {
      // convert to multi-slot constraint
      slots =
          Am_Value_List().Add(interpolator.Get_Slot(Am_SLOT_TO_ANIMATE).Get());
      multi_slot = true;
    }

    // add the slot to the SLOT_TO_ANIMATE list if it isn't already present
    slots.Start();
    if (!slots.Member(key))
    slots.Add((int)key);

    interpolator.Set(Am_SLOT_TO_ANIMATE, slots);
  }

  Init_Target_Value(adding_slot);
  start = target;

  adding_slot.Add_Dependency(this);
  ((Am_Slot *)(&adding_slot))->Invalidate(this);
  return this;
}